

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_CreateVerilogNtk(Cba_Ntk_t *p,Prs_Ntk_t *pNtk)

{
  Vec_Int_t *pVVar1;
  Prs_Ntk_t *pPVar2;
  int iVar3;
  int iVar4;
  Cba_ObjType_t CVar5;
  Cba_ObjType_t CVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint i_00;
  void *p_00;
  int *piVar11;
  size_t sVar12;
  char *pcVar13;
  Cba_Ntk_t *p_01;
  byte bVar14;
  char *pcVar15;
  bool bVar16;
  int iObjNew_2;
  int nFins;
  int Slice;
  int nParts;
  int nBits_1;
  int FonCat;
  int nBits;
  int Index_2;
  Cba_Ntk_t *pBox_1;
  int Index_1;
  int iObjNew_1;
  int Width;
  int w;
  int Status;
  int iBitRst;
  int iBitSet;
  int IndexRst;
  int IndexSet;
  char *pNtkName_1;
  char **pInNames;
  int local_a0;
  int nInputs_1;
  int Index;
  int Prev;
  char *pNtkName;
  char **pOutNames;
  int nOutputs;
  int nInputs;
  Cba_Ntk_t *pBox;
  int local_70;
  int Line;
  int iObjNew;
  int MemSize;
  char *pRamName;
  int Type;
  int NameId;
  int RangeId;
  int ActId;
  int FormId;
  int iFon;
  int iTerm;
  int iObj;
  int k;
  int i;
  Vec_Ptr_t *vRam;
  Vec_Ptr_t *vAllRams;
  Vec_Int_t *vBox;
  Vec_Int_t *vBox2Obj;
  Prs_Ntk_t *pNtk_local;
  Cba_Ntk_t *p_local;
  
  vBox2Obj = (Vec_Int_t *)pNtk;
  pNtk_local = (Prs_Ntk_t *)p;
  iVar3 = Prs_NtkBoxNum(pNtk);
  vBox = Vec_IntStart(iVar3);
  Cba_NtkCleanMap((Cba_Ntk_t *)pNtk_local);
  for (iObj = 0; iVar3 = iObj, iVar4 = Cba_NtkPiNum((Cba_Ntk_t *)pNtk_local), iVar3 < iVar4;
      iObj = iObj + 1) {
    iFon = Cba_NtkPi((Cba_Ntk_t *)pNtk_local,iObj);
    pPVar2 = pNtk_local;
    iVar3 = Cba_ObjName((Cba_Ntk_t *)pNtk_local,iFon);
    iVar4 = Cba_ObjFon0((Cba_Ntk_t *)pNtk_local,iFon);
    Cba_NtkSetMap((Cba_Ntk_t *)pPVar2,iVar3,iVar4);
  }
  for (iObj = 0; iVar3 = iObj, iVar4 = Vec_IntSize(vBox2Obj + 6), iVar3 < iVar4; iObj = iObj + 1) {
    pRamName._4_4_ = Vec_IntEntry(vBox2Obj + 6,iObj);
    Type = Vec_IntEntry(vBox2Obj + 10,iObj);
    Cba_NtkSetMap((Cba_Ntk_t *)pNtk_local,pRamName._4_4_,-Type);
  }
  for (iObj = 0; iVar3 = iObj, iVar4 = Vec_IntSize(vBox2Obj + 5), iVar3 < iVar4; iObj = iObj + 1) {
    pRamName._4_4_ = Vec_IntEntry(vBox2Obj + 5,iObj);
    Type = Vec_IntEntry(vBox2Obj + 9,iObj);
    Cba_NtkSetMap((Cba_Ntk_t *)pNtk_local,pRamName._4_4_,-Type);
  }
  vRam = Prs_CreateDetectRams((Prs_Ntk_t *)vBox2Obj);
  if (vRam != (Vec_Ptr_t *)0x0) {
    for (iObj = 0; iVar3 = iObj, iVar4 = Vec_PtrSize(vRam), iVar3 < iVar4; iObj = iObj + 1) {
      _k = (Vec_Ptr_t *)Vec_PtrEntry(vRam,iObj);
      _iObjNew = (char *)Vec_PtrEntry(_k,0);
      p_00 = Vec_PtrEntry(_k,1);
      Line = Abc_Ptr2Int(p_00);
      pRamName._4_4_ = Cba_NtkNewStrId((Cba_Ntk_t *)pNtk_local,"%s_box",_iObjNew);
      pPVar2 = pNtk_local;
      iVar3 = Vec_PtrSize(_k);
      iFon = Cba_ObjAlloc((Cba_Ntk_t *)pPVar2,CBA_BOX_RAMBOX,iVar3 + -2,1);
      Cba_ObjSetName((Cba_Ntk_t *)pNtk_local,iFon,pRamName._4_4_);
      ActId = Cba_ObjFon0((Cba_Ntk_t *)pNtk_local,iFon);
      pRamName._4_4_ = Cba_NtkNewStrId((Cba_Ntk_t *)pNtk_local,_iObjNew);
      Cba_FonSetName((Cba_Ntk_t *)pNtk_local,ActId,pRamName._4_4_);
      Prs_CreateRange((Cba_Ntk_t *)pNtk_local,ActId,pRamName._4_4_);
      iVar3 = Cba_FonLeft((Cba_Ntk_t *)pNtk_local,ActId);
      if (Line + -1 < iVar3) {
        __assert_fail("Cba_FonLeft(p, iFon) <= MemSize-1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x737,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      iVar3 = Cba_FonRight((Cba_Ntk_t *)pNtk_local,ActId);
      if (iVar3 != 0) {
        __assert_fail("Cba_FonRight(p, iFon) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x738,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      for (iTerm = 2; iVar3 = iTerm, iVar4 = Vec_PtrSize(_k), iVar3 < iVar4; iTerm = iTerm + 1) {
        vAllRams = (Vec_Ptr_t *)Vec_PtrEntry(_k,iTerm);
        local_70 = Cba_ObjAlloc((Cba_Ntk_t *)pNtk_local,CBA_BOX_RAMWC,4,1);
        pBox._4_4_ = Vec_IntPop((Vec_Int_t *)vAllRams);
        Vec_IntWriteEntry(vBox,pBox._4_4_,local_70);
        iVar4 = Prs_BoxName((Prs_Ntk_t *)vBox2Obj,pBox._4_4_);
        pPVar2 = pNtk_local;
        iVar3 = local_70;
        if (iVar4 != 0) {
          iVar4 = Prs_BoxName((Prs_Ntk_t *)vBox2Obj,pBox._4_4_);
          Cba_ObjSetName((Cba_Ntk_t *)pPVar2,iVar3,iVar4);
        }
        iVar3 = Cba_ObjFon0((Cba_Ntk_t *)pNtk_local,local_70);
        pPVar2 = pNtk_local;
        ActId = iVar3;
        iVar4 = Cba_NtkHashRange((Cba_Ntk_t *)pNtk_local,Line + -1,0);
        Cba_FonSetRange((Cba_Ntk_t *)pPVar2,iVar3,iVar4);
        pRamName._4_4_ =
             Cba_NtkNewStrId((Cba_Ntk_t *)pNtk_local,"%s_wp%d",_iObjNew,(ulong)(iTerm - 2));
        Cba_FonSetName((Cba_Ntk_t *)pNtk_local,ActId,pRamName._4_4_);
        Cba_NtkSetMap((Cba_Ntk_t *)pNtk_local,pRamName._4_4_,ActId);
        iVar3 = iTerm + -2;
        iTerm = iTerm + 1;
        Cba_ObjSetFinFon((Cba_Ntk_t *)pNtk_local,iFon,iVar3,ActId);
        Vec_IntFree((Vec_Int_t *)vAllRams);
      }
      Vec_PtrFree(_k);
    }
  }
  Vec_PtrFreeP(&vRam);
  Vec_IntClear(&pNtk_local[1].vWiresR);
  iObj = 0;
  while( true ) {
    iVar3 = iObj;
    iVar4 = Prs_NtkBoxNum((Prs_Ntk_t *)vBox2Obj);
    bVar16 = false;
    if (iVar3 < iVar4) {
      vAllRams = (Vec_Ptr_t *)Prs_BoxSignals((Prs_Ntk_t *)vBox2Obj,iObj);
      bVar16 = vAllRams != (Vec_Ptr_t *)0x0;
    }
    if (!bVar16) break;
    iVar3 = Prs_BoxIsNode((Prs_Ntk_t *)vBox2Obj,iObj);
    pVVar1 = vBox2Obj;
    if (iVar3 == 0) {
      _nOutputs = (Cba_Ntk_t *)0x0;
      pOutNames._0_4_ = 1;
      pNtkName = (char *)0x0;
      iVar3 = Prs_BoxNtk((Prs_Ntk_t *)vBox2Obj,iObj);
      _Index = Prs_NtkStr((Prs_Ntk_t *)pVVar1,iVar3);
      pRamName._0_4_ = Prs_ManFindType(_Index,(int *)((long)&pOutNames + 4),1,(char ***)&pNtkName);
      if ((Cba_ObjType_t)pRamName != CBA_BOX_RAMWC) {
        if ((Cba_ObjType_t)pRamName == CBA_OBJ_BOX) {
          _nOutputs = Cba_ManNtkFind(*(Cba_Man_t **)pNtk_local,_Index);
          if (_nOutputs == (Cba_Ntk_t *)0x0) {
            printf("Fatal error: Cannot find module \"%s\".\n",_Index);
            goto LAB_00491263;
          }
          pOutNames._4_4_ = Cba_NtkPiNum(_nOutputs);
          pOutNames._0_4_ = Cba_NtkPoNum(_nOutputs);
        }
        else if (((Cba_ObjType_t)pRamName == CBA_BOX_ADD) ||
                ((Cba_ObjType_t)pRamName == CBA_BOX_DFFCPL)) {
          pOutNames._0_4_ = 2;
        }
        else if ((Cba_ObjType_t)pRamName == CBA_BOX_NMUX) {
          iVar3 = strncmp(_Index,"wide_mux_",9);
          if (iVar3 == 0) {
            iVar3 = atoi(_Index + 9);
            bVar14 = (byte)iVar3;
          }
          else {
            iVar3 = strncmp(_Index,"Mux_",4);
            if (iVar3 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x777,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            iVar3 = atoi(_Index + 4);
            bVar14 = (byte)iVar3;
          }
          pOutNames._4_4_ = (1 << (bVar14 & 0x1f)) + 1;
        }
        else if ((Cba_ObjType_t)pRamName == CBA_BOX_SEL) {
          iVar3 = strncmp(_Index,"wide_select_",0xc);
          if (iVar3 == 0) {
            iVar3 = atoi(_Index + 0xc);
          }
          else {
            iVar3 = strncmp(_Index,"Select_",7);
            if (iVar3 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x77f,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            iVar3 = atoi(_Index + 7);
          }
          pOutNames._4_4_ = iVar3 + 1;
        }
        else if (((((Cba_ObjType_t)pRamName == CBA_BOX_DFFRS) ||
                  ((Cba_ObjType_t)pRamName == CBA_BOX_LATCHRS)) &&
                 (iVar3 = strncmp(_Index,"wide_",5), iVar3 == 0)) &&
                (iVar3 = Prs_CreateFlopSetReset
                                   ((Cba_Ntk_t *)pNtk_local,(Prs_Ntk_t *)vBox2Obj,
                                    (Vec_Int_t *)vAllRams,(int *)0x0,(int *)0x0,(int *)0x0,
                                    (int *)0x0), pcVar13 = _Index, iVar3 == 0)) {
          pcVar15 = "wide_latchrs_";
          if ((Cba_ObjType_t)pRamName == CBA_BOX_DFFRS) {
            pcVar15 = "wide_dffrs_";
          }
          sVar12 = strlen(pcVar15);
          pOutNames._4_4_ = atoi(pcVar13 + sVar12);
          pOutNames._0_4_ = 1;
          pRamName._0_4_ = CBA_BOX_CONCAT;
        }
        iVar3 = Cba_ObjAlloc((Cba_Ntk_t *)pNtk_local,(Cba_ObjType_t)pRamName,pOutNames._4_4_,
                             (int)pOutNames);
        pPVar2 = pNtk_local;
        iFon = iVar3;
        if (_nOutputs != (Cba_Ntk_t *)0x0) {
          iVar4 = Cba_NtkId(_nOutputs);
          Cba_ObjSetFunc((Cba_Ntk_t *)pPVar2,iVar3,iVar4);
        }
        Cba_NtkCleanMap2((Cba_Ntk_t *)pNtk_local);
        if (_nOutputs == (Cba_Ntk_t *)0x0) {
          for (iTerm = 0; pPVar2 = pNtk_local, iTerm < (int)pOutNames; iTerm = iTerm + 1) {
            iVar3 = Cba_NtkStrId((Cba_Ntk_t *)pNtk_local,*(char **)(pNtkName + (long)iTerm * 8));
            Cba_NtkSetMap2((Cba_Ntk_t *)pPVar2,iVar3,iTerm + 1);
          }
        }
        else {
          for (iTerm = 0; iVar3 = iTerm, iVar4 = Cba_NtkPoNum(_nOutputs), iVar3 < iVar4;
              iTerm = iTerm + 1) {
            FormId = Cba_NtkPo(_nOutputs,iTerm);
            pPVar2 = pNtk_local;
            iVar3 = Cba_ObjName(_nOutputs,FormId);
            Cba_NtkSetMap2((Cba_Ntk_t *)pPVar2,iVar3,iTerm + 1);
          }
        }
        for (iTerm = 0; iVar3 = iTerm + 1, iVar4 = Vec_IntSize((Vec_Int_t *)vAllRams), iVar3 < iVar4
            ; iTerm = iTerm + 2) {
          RangeId = Vec_IntEntry((Vec_Int_t *)vAllRams,iTerm);
          NameId = Vec_IntEntry((Vec_Int_t *)vAllRams,iTerm + 1);
          iVar4 = Cba_NtkGetMap2((Cba_Ntk_t *)pNtk_local,RangeId);
          pPVar2 = pNtk_local;
          iVar3 = iFon;
          if (iVar4 != 0) {
            iVar4 = Cba_NtkGetMap2((Cba_Ntk_t *)pNtk_local,RangeId);
            ActId = Cba_ObjFon((Cba_Ntk_t *)pPVar2,iVar3,iVar4 + -1);
            Prs_CreateSignalOut((Cba_Ntk_t *)pNtk_local,ActId,(Prs_Ntk_t *)vBox2Obj,NameId);
          }
        }
        goto LAB_0049120d;
      }
    }
    else {
      CVar5 = Prs_BoxNtk((Prs_Ntk_t *)vBox2Obj,iObj);
      pPVar2 = pNtk_local;
      pRamName._0_4_ = CVar5;
      iVar4 = Prs_BoxIONum((Prs_Ntk_t *)vBox2Obj,iObj);
      iVar3 = 1;
      if ((Cba_ObjType_t)pRamName == CBA_BOX_ADD) {
        iVar3 = 2;
      }
      iFon = Cba_ObjAlloc((Cba_Ntk_t *)pPVar2,CVar5,iVar4 + -1,iVar3);
      pPVar2 = pNtk_local;
      iVar3 = Cba_ObjFon0((Cba_Ntk_t *)pNtk_local,iFon);
      pVVar1 = vBox2Obj;
      iVar4 = Vec_IntEntry((Vec_Int_t *)vAllRams,1);
      Prs_CreateSignalOut((Cba_Ntk_t *)pPVar2,iVar3,(Prs_Ntk_t *)pVVar1,iVar4);
LAB_0049120d:
      Vec_IntWriteEntry(vBox,iObj,iFon);
      iVar4 = Prs_BoxName((Prs_Ntk_t *)vBox2Obj,iObj);
      pPVar2 = pNtk_local;
      iVar3 = iFon;
      if (iVar4 != 0) {
        iVar4 = Prs_BoxName((Prs_Ntk_t *)vBox2Obj,iObj);
        Cba_ObjSetName((Cba_Ntk_t *)pPVar2,iVar3,iVar4);
      }
    }
LAB_00491263:
    iObj = iObj + 1;
  }
  iVar3 = Vec_IntSize(&pNtk_local[1].vWiresR);
  if (iVar3 != 0) {
    nInputs_1 = -1;
    local_a0 = 0;
    Vec_IntSortMulti(&pNtk_local[1].vWiresR,3,0);
    for (iObj = 0; iVar3 = iObj + 2, iVar4 = Vec_IntSize(&pNtk_local[1].vWiresR),
        pPVar2 = pNtk_local, iVar3 < iVar4; iObj = iObj + 3) {
      pRamName._4_4_ = Vec_IntEntry(&pNtk_local[1].vWiresR,iObj);
      Type = Vec_IntEntry(&pNtk_local[1].vWiresR,iObj + 1);
      ActId = Vec_IntEntry(&pNtk_local[1].vWiresR,iObj + 2);
      pPVar2 = pNtk_local;
      if ((nInputs_1 != -1) && (nInputs_1 != pRamName._4_4_)) {
        piVar11 = Vec_IntArray(&pNtk_local[1].vWiresR);
        Prs_CreateOutConcat((Cba_Ntk_t *)pPVar2,piVar11 + local_a0,(iObj - local_a0) / 3);
        local_a0 = iObj;
      }
      nInputs_1 = pRamName._4_4_;
    }
    piVar11 = Vec_IntArray(&pNtk_local[1].vWiresR);
    Prs_CreateOutConcat((Cba_Ntk_t *)pPVar2,piVar11 + local_a0,(iObj - local_a0) / 3);
    local_a0 = iObj;
  }
  iObj = 0;
  do {
    iVar3 = iObj;
    iVar4 = Prs_NtkBoxNum((Prs_Ntk_t *)vBox2Obj);
    bVar16 = false;
    if (iVar3 < iVar4) {
      vAllRams = (Vec_Ptr_t *)Prs_BoxSignals((Prs_Ntk_t *)vBox2Obj,iObj);
      bVar16 = vAllRams != (Vec_Ptr_t *)0x0;
    }
    if (!bVar16) {
      Vec_IntFree(vBox);
      iObj = 0;
      do {
        iVar3 = iObj;
        iVar4 = Vec_IntSize(vBox2Obj + 5);
        if (iVar4 <= iVar3) {
          return 0;
        }
        pRamName._4_4_ = Vec_IntEntry(vBox2Obj + 5,iObj);
        Type = Vec_IntEntry(vBox2Obj + 9,iObj);
        iFon = Cba_NtkPo((Cba_Ntk_t *)pNtk_local,iObj);
        iVar3 = pRamName._4_4_;
        iVar4 = Cba_ObjName((Cba_Ntk_t *)pNtk_local,iFon);
        if (iVar3 != iVar4) {
          __assert_fail("NameId == Cba_ObjName(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x83e,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
        }
        ActId = Prs_CreateVerilogFindFon((Cba_Ntk_t *)pNtk_local,pRamName._4_4_);
        if ((ActId != 0) &&
           (Cba_ObjSetFinFon((Cba_Ntk_t *)pNtk_local,iFon,0,ActId), pPVar2 = pNtk_local, Type != 0))
        {
          iVar3 = Abc_Lit2Var(Type);
          iVar3 = Cba_NtkRangeLeft((Cba_Ntk_t *)pPVar2,iVar3);
          iVar4 = Cba_FonLeft((Cba_Ntk_t *)pNtk_local,ActId);
          pPVar2 = pNtk_local;
          if (iVar3 != iVar4) {
            __assert_fail("Cba_NtkRangeLeft(p, Abc_Lit2Var(RangeId)) == Cba_FonLeft(p, iFon)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x845,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          iVar3 = Abc_Lit2Var(Type);
          iVar3 = Cba_NtkRangeRight((Cba_Ntk_t *)pPVar2,iVar3);
          iVar4 = Cba_FonRight((Cba_Ntk_t *)pNtk_local,ActId);
          if (iVar3 != iVar4) {
            __assert_fail("Cba_NtkRangeRight(p, Abc_Lit2Var(RangeId)) == Cba_FonRight(p, iFon)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x846,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
        }
        iObj = iObj + 1;
      } while( true );
    }
    iFon = Vec_IntEntry(vBox,iObj);
    iVar3 = Prs_BoxIsNode((Prs_Ntk_t *)vBox2Obj,iObj);
    pVVar1 = vBox2Obj;
    if (iVar3 == 0) {
      pInNames._4_4_ = -1;
      pNtkName_1 = (char *)0x0;
      iVar3 = Prs_BoxNtk((Prs_Ntk_t *)vBox2Obj,iObj);
      _IndexRst = Prs_NtkStr((Prs_Ntk_t *)pVVar1,iVar3);
      pRamName._0_4_ =
           Prs_ManFindType(_IndexRst,(int *)((long)&pInNames + 4),0,(char ***)&pNtkName_1);
      if ((((Cba_ObjType_t)pRamName != CBA_BOX_DFFRS) &&
          ((Cba_ObjType_t)pRamName != CBA_BOX_LATCHRS)) ||
         (iVar3 = strncmp(_IndexRst,"wide_",5), iVar3 != 0)) {
LAB_00491a29:
        CVar5 = (Cba_ObjType_t)pRamName;
        CVar6 = Cba_ObjType((Cba_Ntk_t *)pNtk_local,iFon);
        if (CVar5 != CVar6) {
          __assert_fail("Type == Cba_ObjType(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x7f5,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
        }
        Cba_NtkCleanMap2((Cba_Ntk_t *)pNtk_local);
        if ((Cba_ObjType_t)pRamName == CBA_OBJ_BOX) {
          p_01 = Cba_ObjNtk((Cba_Ntk_t *)pNtk_local,iFon);
          iVar3 = Cba_NtkPiNum(p_01);
          iVar4 = Cba_ObjFinNum((Cba_Ntk_t *)pNtk_local,iFon);
          if (iVar3 != iVar4) {
            __assert_fail("Cba_NtkPiNum(pBox) == Cba_ObjFinNum(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x7fc,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          iVar3 = Cba_NtkPoNum(p_01);
          iVar4 = Cba_ObjFonNum((Cba_Ntk_t *)pNtk_local,iFon);
          if (iVar3 != iVar4) {
            __assert_fail("Cba_NtkPoNum(pBox) == Cba_ObjFonNum(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x7fd,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          for (iTerm = 0; iVar3 = iTerm, iVar4 = Cba_NtkPiNum(p_01), iVar3 < iVar4;
              iTerm = iTerm + 1) {
            FormId = Cba_NtkPi(p_01,iTerm);
            pPVar2 = pNtk_local;
            iVar3 = Cba_ObjName(p_01,FormId);
            Cba_NtkSetMap2((Cba_Ntk_t *)pPVar2,iVar3,iTerm + 1);
          }
        }
        else {
          if (pInNames._4_4_ < 0) {
            __assert_fail("nInputs >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x803,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          for (iTerm = 0; pPVar2 = pNtk_local, iTerm < pInNames._4_4_; iTerm = iTerm + 1) {
            iVar3 = Cba_NtkStrId((Cba_Ntk_t *)pNtk_local,*(char **)(pNtkName_1 + (long)iTerm * 8));
            Cba_NtkSetMap2((Cba_Ntk_t *)pPVar2,iVar3,iTerm + 1);
          }
        }
        for (iTerm = 0; iVar3 = iTerm + 1, iVar4 = Vec_IntSize((Vec_Int_t *)vAllRams), iVar3 < iVar4
            ; iTerm = iTerm + 2) {
          RangeId = Vec_IntEntry((Vec_Int_t *)vAllRams,iTerm);
          NameId = Vec_IntEntry((Vec_Int_t *)vAllRams,iTerm + 1);
          iVar3 = Cba_NtkGetMap2((Cba_Ntk_t *)pNtk_local,RangeId);
          if (iVar3 != 0) {
            iVar3 = Cba_NtkGetMap2((Cba_Ntk_t *)pNtk_local,RangeId);
            iVar4 = Cba_ObjFinNum((Cba_Ntk_t *)pNtk_local,iFon);
            if (iVar4 <= iVar3 + -1) {
              __assert_fail("Index < nBits",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x80d,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            ActId = Prs_CreateSignalIn((Cba_Ntk_t *)pNtk_local,(Prs_Ntk_t *)vBox2Obj,NameId);
            if (ActId != 0) {
              Cba_ObjSetFinFon((Cba_Ntk_t *)pNtk_local,iFon,iVar3 + -1,ActId);
            }
          }
        }
        if (((Cba_ObjType_t)pRamName == CBA_BOX_NMUX) || ((Cba_ObjType_t)pRamName == CBA_BOX_SEL)) {
          nParts = Cba_ObjFinFon((Cba_Ntk_t *)pNtk_local,iFon,1);
          iVar3 = Cba_FonRangeSize((Cba_Ntk_t *)pNtk_local,nParts);
          iVar4 = Cba_ObjFinNum((Cba_Ntk_t *)pNtk_local,iFon);
          iVar7 = iVar4 + -1;
          iVar8 = iVar3 / iVar7;
          iVar9 = Cba_ObjFinNum((Cba_Ntk_t *)pNtk_local,iFon);
          iVar10 = Cba_ObjFinNum((Cba_Ntk_t *)pNtk_local,iFon);
          if (iVar10 < 2) {
            __assert_fail("Cba_ObjFinNum(p, iObj) >= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x81a,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          if (iVar8 * iVar7 != iVar3) {
            __assert_fail("Slice * nParts == nBits",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x81b,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          if (iVar9 != iVar4) {
            __assert_fail("nFins == 1 + nParts",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x81c,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          Cba_ObjCleanFinFon((Cba_Ntk_t *)pNtk_local,iFon,1);
          if (nParts < 0) {
            i_00 = Cba_ObjAlloc((Cba_Ntk_t *)pNtk_local,CBA_BOX_BUF,1,1);
            Cba_ObjSetFinFon((Cba_Ntk_t *)pNtk_local,i_00,0,nParts);
            nParts = Cba_ObjFon0((Cba_Ntk_t *)pNtk_local,i_00);
            pRamName._4_4_ = Cba_NtkNewStrId((Cba_Ntk_t *)pNtk_local,"_buf_const_%d",(ulong)i_00);
            Cba_FonSetName((Cba_Ntk_t *)pNtk_local,nParts,pRamName._4_4_);
            pPVar2 = pNtk_local;
            iVar3 = Cba_NtkHashRange((Cba_Ntk_t *)pNtk_local,iVar3 + -1,0);
            Cba_FonSetRange((Cba_Ntk_t *)pPVar2,nParts,iVar3);
          }
          for (iTerm = 0; pPVar2 = pNtk_local, pVVar1 = vBox2Obj, iTerm < iVar7; iTerm = iTerm + 1)
          {
            iVar3 = Cba_NtkHashRange((Cba_Ntk_t *)pNtk_local,iTerm * iVar8 + iVar8 + -1,
                                     iTerm * iVar8);
            ActId = Prs_CreateSlice((Cba_Ntk_t *)pPVar2,nParts,(Prs_Ntk_t *)pVVar1,iVar3);
            Cba_ObjSetFinFon((Cba_Ntk_t *)pNtk_local,iFon,iTerm + 1,ActId);
          }
        }
        goto LAB_00491fe8;
      }
      iBitSet = -1;
      iBitRst = -1;
      Status = -1;
      w = -1;
      iVar3 = Prs_CreateFlopSetReset
                        ((Cba_Ntk_t *)pNtk_local,(Prs_Ntk_t *)vBox2Obj,(Vec_Int_t *)vAllRams,
                         &iBitSet,&iBitRst,&Status,&w);
      pcVar13 = _IndexRst;
      if (iVar3 != 0) {
        Vec_IntWriteEntry((Vec_Int_t *)vAllRams,iBitSet,Status);
        Vec_IntWriteEntry((Vec_Int_t *)vAllRams,iBitRst,w);
        goto LAB_00491a29;
      }
      pcVar15 = "wide_latchrs_";
      if ((Cba_ObjType_t)pRamName == CBA_BOX_DFFRS) {
        pcVar15 = "wide_dffrs_";
      }
      sVar12 = strlen(pcVar15);
      iVar3 = atoi(pcVar13 + sVar12);
      CVar5 = Cba_ObjType((Cba_Ntk_t *)pNtk_local,iFon);
      if (CVar5 != CBA_BOX_CONCAT) {
        __assert_fail("Cba_ObjType(p, iObj) == CBA_BOX_CONCAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x7cb,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      if (pInNames._4_4_ < 0) {
        __assert_fail("nInputs >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x7cd,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      Cba_NtkCleanMap2((Cba_Ntk_t *)pNtk_local);
      for (iTerm = 0; pPVar2 = pNtk_local, iTerm < pInNames._4_4_; iTerm = iTerm + 1) {
        iVar4 = Cba_NtkStrId((Cba_Ntk_t *)pNtk_local,*(char **)(pNtkName_1 + (long)iTerm * 8));
        Cba_NtkSetMap2((Cba_Ntk_t *)pPVar2,iVar4,iTerm + 1);
      }
      for (iObjNew_1 = 0; iObjNew_1 < iVar3; iObjNew_1 = iObjNew_1 + 1) {
        iVar4 = Cba_ObjAlloc((Cba_Ntk_t *)pNtk_local,(Cba_ObjType_t)pRamName,4,1);
        iVar7 = Prs_BoxName((Prs_Ntk_t *)vBox2Obj,iObj);
        pPVar2 = pNtk_local;
        pVVar1 = vBox2Obj;
        if (iVar7 != 0) {
          iVar7 = Prs_BoxName((Prs_Ntk_t *)vBox2Obj,iObj);
          pcVar13 = Prs_NtkStr((Prs_Ntk_t *)pVVar1,iVar7);
          pRamName._4_4_ =
               Cba_NtkNewStrId((Cba_Ntk_t *)pPVar2,"%s[%d]",pcVar13,(ulong)(uint)iObjNew_1);
          Cba_ObjSetName((Cba_Ntk_t *)pNtk_local,iVar4,pRamName._4_4_);
        }
        ActId = Cba_ObjFon0((Cba_Ntk_t *)pNtk_local,iVar4);
        pPVar2 = pNtk_local;
        iVar7 = Cba_ObjFon0((Cba_Ntk_t *)pNtk_local,iFon);
        pcVar13 = Cba_FonNameStr((Cba_Ntk_t *)pPVar2,iVar7);
        pRamName._4_4_ =
             Cba_NtkNewStrId((Cba_Ntk_t *)pPVar2,"%s[%d]",pcVar13,(ulong)(uint)iObjNew_1);
        Cba_FonSetName((Cba_Ntk_t *)pNtk_local,ActId,pRamName._4_4_);
        Cba_ObjSetFinFon((Cba_Ntk_t *)pNtk_local,iFon,(iVar3 + -1) - iObjNew_1,ActId);
        for (iTerm = 0; iVar7 = iTerm + 1, iVar8 = Vec_IntSize((Vec_Int_t *)vAllRams), iVar7 < iVar8
            ; iTerm = iTerm + 2) {
          RangeId = Vec_IntEntry((Vec_Int_t *)vAllRams,iTerm);
          NameId = Vec_IntEntry((Vec_Int_t *)vAllRams,iTerm + 1);
          iVar7 = Cba_NtkGetMap2((Cba_Ntk_t *)pNtk_local,RangeId);
          if (iVar7 != 0) {
            iVar7 = Cba_NtkGetMap2((Cba_Ntk_t *)pNtk_local,RangeId);
            ActId = Prs_CreateSignalIn((Cba_Ntk_t *)pNtk_local,(Prs_Ntk_t *)vBox2Obj,NameId);
            if (ActId == 0) {
              __assert_fail("iFon",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x7eb,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            if (iVar7 + -1 < 3) {
              ActId = Prs_CreateSlice((Cba_Ntk_t *)pNtk_local,ActId,(Prs_Ntk_t *)vBox2Obj,0);
            }
            Cba_ObjSetFinFon((Cba_Ntk_t *)pNtk_local,iVar4,iVar7 + -1,ActId);
          }
        }
      }
    }
    else {
      pRamName._0_4_ = Prs_BoxNtk((Prs_Ntk_t *)vBox2Obj,iObj);
      for (iTerm = 2; iVar3 = iTerm + 1, iVar4 = Vec_IntSize((Vec_Int_t *)vAllRams), iVar3 < iVar4;
          iTerm = iTerm + 2) {
        RangeId = Vec_IntEntry((Vec_Int_t *)vAllRams,iTerm);
        NameId = Vec_IntEntry((Vec_Int_t *)vAllRams,iTerm + 1);
        ActId = Prs_CreateSignalIn((Cba_Ntk_t *)pNtk_local,(Prs_Ntk_t *)vBox2Obj,NameId);
        if (ActId != 0) {
          Cba_ObjSetFinFon((Cba_Ntk_t *)pNtk_local,iFon,iTerm / 2 + -1,ActId);
        }
      }
LAB_00491fe8:
      if (((Cba_ObjType_t)pRamName == CBA_BOX_ADD) &&
         (iVar4 = Cba_ObjFinFon((Cba_Ntk_t *)pNtk_local,iFon,0), pPVar2 = pNtk_local, iVar3 = iFon,
         iVar4 == 0)) {
        iVar4 = Cba_FonFromConst(1);
        Cba_ObjSetFinFon((Cba_Ntk_t *)pPVar2,iVar3,0,iVar4);
      }
      if (((Cba_ObjType_t)pRamName == CBA_BOX_DFFRS) &&
         (iVar4 = Cba_ObjFinFon((Cba_Ntk_t *)pNtk_local,iFon,1), pPVar2 = pNtk_local, iVar3 = iFon,
         iVar4 == 0)) {
        iVar4 = Cba_FonFromConst(1);
        Cba_ObjSetFinFon((Cba_Ntk_t *)pPVar2,iVar3,1,iVar4);
      }
      if (((Cba_ObjType_t)pRamName == CBA_BOX_DFFRS) &&
         (iVar4 = Cba_ObjFinFon((Cba_Ntk_t *)pNtk_local,iFon,2), pPVar2 = pNtk_local, iVar3 = iFon,
         iVar4 == 0)) {
        iVar4 = Cba_FonFromConst(1);
        Cba_ObjSetFinFon((Cba_Ntk_t *)pPVar2,iVar3,2,iVar4);
      }
    }
    iObj = iObj + 1;
  } while( true );
}

Assistant:

int Prs_CreateVerilogNtk( Cba_Ntk_t * p, Prs_Ntk_t * pNtk )
{
    Vec_Int_t * vBox2Obj = Vec_IntStart( Prs_NtkBoxNum(pNtk) );
    Vec_Int_t * vBox;  Vec_Ptr_t * vAllRams, * vRam;
    int i, k, iObj, iTerm, iFon, FormId, ActId, RangeId, NameId, Type;
    // map inputs
    Cba_NtkCleanMap( p );
    Cba_NtkForEachPi( p, iObj, i )
        Cba_NtkSetMap( p, Cba_ObjName(p, iObj), Cba_ObjFon0(p, iObj) );

    // map wire names into their rangeID
    Vec_IntForEachEntryTwo( &pNtk->vWires, &pNtk->vWiresR, NameId, RangeId, i )
        Cba_NtkSetMap( p, NameId, -RangeId );
    Vec_IntForEachEntryTwo( &pNtk->vOutputs, &pNtk->vOutputsR, NameId, RangeId, i )
        Cba_NtkSetMap( p, NameId, -RangeId );

    // collect RAMs and create boxes
    vAllRams = Prs_CreateDetectRams( pNtk );
    if ( vAllRams )
    Vec_PtrForEachEntry( Vec_Ptr_t *, vAllRams, vRam, i )
    {
        char * pRamName = (char *)Vec_PtrEntry( vRam, 0 );
        int MemSize = Abc_Ptr2Int( (char *)Vec_PtrEntry( vRam, 1 ) );
        //char Buffer[1000]; sprintf( Buffer, "%s_box", pRamName );
        //NameId = Cba_NtkNewStrId( p, Buffer ); 
        NameId = Cba_NtkNewStrId( p, "%s_box", pRamName );
        // create RAM object
        iObj = Cba_ObjAlloc( p, CBA_BOX_RAMBOX, Vec_PtrSize(vRam)-2, 1 );
        Cba_ObjSetName( p, iObj, NameId );
        iFon = Cba_ObjFon0(p, iObj);
        NameId = Cba_NtkNewStrId( p, pRamName ); 
        Cba_FonSetName( p, iFon, NameId );
        Prs_CreateRange( p, iFon, NameId );
        assert( Cba_FonLeft(p, iFon) <= MemSize-1 );
        assert( Cba_FonRight(p, iFon) == 0 );
        //Cba_VerificSaveLineFile( p, iObj, pNet->Linefile() );
        // create write ports feeding into this object
        Vec_PtrForEachEntryStart( Vec_Int_t *, vRam, vBox, k, 2 )
        {
            int iObjNew = Cba_ObjAlloc( p, CBA_BOX_RAMWC, 4, 1 );
            int Line = Vec_IntPop( vBox );
            Vec_IntWriteEntry( vBox2Obj, Line, iObjNew );
            if ( Prs_BoxName(pNtk, Line) )
                Cba_ObjSetName( p, iObjNew, Prs_BoxName(pNtk, Line) );
            //Cba_VerificSaveLineFile( p, iObjNew, pInst->Linefile() );
            // connect output
            iFon = Cba_ObjFon0(p, iObjNew);
            Cba_FonSetRange( p, iFon, Cba_NtkHashRange(p, MemSize-1, 0) );
            //sprintf( Buffer, "%s_wp%d", pRamName, k-2 );
            //NameId = Cba_NtkNewStrId( p, Buffer ); 
            NameId = Cba_NtkNewStrId( p, "%s_wp%d", pRamName, k-2 );
            Cba_FonSetName( p, iFon, NameId );
            Cba_NtkSetMap( p, NameId, iFon );
            // connet to RAM object
            Cba_ObjSetFinFon( p, iObj, (k++)-2, iFon );
            Vec_IntFree( vBox );
        }
        Vec_PtrFree( vRam );
    }
    Vec_PtrFreeP( &vAllRams );

    // create objects
    Vec_IntClear( &p->vArray0 );
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        if ( Prs_BoxIsNode(pNtk, i) ) // node
        {
            Type = Prs_BoxNtk(pNtk, i);
            iObj = Cba_ObjAlloc( p, (Cba_ObjType_t)Type, Prs_BoxIONum(pNtk, i)-1, Type == CBA_BOX_ADD ? 2 : 1 );
            Prs_CreateSignalOut( p, Cba_ObjFon0(p, iObj), pNtk, Vec_IntEntry(vBox, 1) ); // node output
        }
        else // box
        {
            Cba_Ntk_t * pBox = NULL; int nInputs, nOutputs = 1;
            char ** pOutNames = NULL, * pNtkName = Prs_NtkStr(pNtk, Prs_BoxNtk(pNtk, i));
            Type = Prs_ManFindType( pNtkName, &nInputs, 1, &pOutNames );
            if ( Type == CBA_BOX_RAMWC )
                continue;
            if ( Type == CBA_OBJ_BOX )
            {
                pBox = Cba_ManNtkFind( p->pDesign, pNtkName );
                if ( pBox == NULL )
                {
                    printf( "Fatal error: Cannot find module \"%s\".\n", pNtkName );
                    continue;
                }
                nInputs = Cba_NtkPiNum(pBox);
                nOutputs = Cba_NtkPoNum(pBox);
            }
            else if ( Type == CBA_BOX_ADD || Type == CBA_BOX_DFFCPL )
                nOutputs = 2;
            else if ( Type == CBA_BOX_NMUX )
            {
                if ( !strncmp(pNtkName, "wide_mux_", strlen("wide_mux_")) )
                    nInputs = 1 + (1 << atoi(pNtkName+strlen("wide_mux_")));
                else if ( !strncmp(pNtkName, "Mux_", strlen("Mux_")) )
                    nInputs = 1 + (1 << atoi(pNtkName+strlen("Mux_")));
                else assert( 0 );
            }
            else if ( Type == CBA_BOX_SEL )
            {
                if ( !strncmp(pNtkName, "wide_select_", strlen("wide_select_")) )
                    nInputs = 1 + atoi(pNtkName+strlen("wide_select_"));
                else if ( !strncmp(pNtkName, "Select_", strlen("Select_")) )
                    nInputs = 1 + atoi(pNtkName+strlen("Select_"));
                else assert( 0 );
            }
            else if ( (Type == CBA_BOX_DFFRS || Type == CBA_BOX_LATCHRS) && !strncmp(pNtkName, "wide_", strlen("wide_")) && !Prs_CreateFlopSetReset(p, pNtk, vBox, NULL, NULL, NULL, NULL) )
                nInputs = atoi(pNtkName+strlen(Type == CBA_BOX_DFFRS ? "wide_dffrs_" : "wide_latchrs_")), nOutputs = 1, Type = CBA_BOX_CONCAT;
            // create object
            iObj = Cba_ObjAlloc( p, (Cba_ObjType_t)Type, nInputs, nOutputs );
            if ( pBox ) Cba_ObjSetFunc( p, iObj, Cba_NtkId(pBox) );
            // mark PO objects
            Cba_NtkCleanMap2( p );
            if ( pBox )
                Cba_NtkForEachPo( pBox, iTerm, k )
                    Cba_NtkSetMap2( p, Cba_ObjName(pBox, iTerm), k+1 );
            else
                for ( k = 0; k < nOutputs; k++ )
                    Cba_NtkSetMap2( p, Cba_NtkStrId(p, pOutNames[k]), k+1 );
            // map box fons
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                if ( Cba_NtkGetMap2(p, FormId) )
                {
                    iFon = Cba_ObjFon(p, iObj, Cba_NtkGetMap2(p, FormId)-1);
                    Prs_CreateSignalOut( p, iFon, pNtk, ActId );
                }
        }
        Vec_IntWriteEntry( vBox2Obj, i, iObj );
        if ( Prs_BoxName(pNtk, i) )
            Cba_ObjSetName( p, iObj, Prs_BoxName(pNtk, i) );
        //Cba_VerificSaveLineFile( p, iObj, pInst->Linefile() );
    }

    // create concatenations for split signals
    if ( Vec_IntSize(&p->vArray0) )
    {
        int Prev = -1, Index = 0;
        Vec_IntSortMulti( &p->vArray0, 3, 0 );
        Vec_IntForEachEntryTriple( &p->vArray0, NameId, RangeId, iFon, i )
        {
            if ( Prev != -1 && Prev != NameId )
                Prs_CreateOutConcat( p, Vec_IntArray(&p->vArray0) + Index, (i - Index)/3 ), Index = i;
            Prev = NameId;         
        }
        Prs_CreateOutConcat( p, Vec_IntArray(&p->vArray0) + Index, (i - Index)/3 ), Index = i;
        //Cba_VerificSaveLineFile( p, iObj, pInst->Linefile() );
    }

    // connect objects
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        iObj = Vec_IntEntry( vBox2Obj, i );
        if ( Prs_BoxIsNode(pNtk, i) ) // node
        {
            Type = Prs_BoxNtk(pNtk, i);
            Vec_IntForEachEntryDoubleStart( vBox, FormId, ActId, k, 2 )
            {
                iFon = Prs_CreateSignalIn( p, pNtk, ActId );
                if ( iFon )
                    Cba_ObjSetFinFon( p, iObj, k/2-1, iFon ); 
            }
        }
        else // box
        {
            int nInputs = -1;
            char ** pInNames = NULL, * pNtkName = Prs_NtkStr(pNtk, Prs_BoxNtk(pNtk, i));
            Type = Prs_ManFindType( pNtkName, &nInputs, 0, &pInNames );
            if ( (Type == CBA_BOX_DFFRS || Type == CBA_BOX_LATCHRS) && !strncmp(pNtkName, "wide_", strlen("wide_")) )
            {
                int IndexSet = -1, IndexRst = -1,  iBitSet = -1, iBitRst = -1;
                int Status = Prs_CreateFlopSetReset( p, pNtk, vBox, &IndexSet, &IndexRst, &iBitSet, &iBitRst );
                if ( Status )
                {
                    Vec_IntWriteEntry( vBox, IndexSet, iBitSet );
                    Vec_IntWriteEntry( vBox, IndexRst, iBitRst );
                    // updated box should be fine
                }
                else
                {
                    int w, Width = atoi( pNtkName + strlen(Type == CBA_BOX_DFFRS ? "wide_dffrs_" : "wide_latchrs_") );
                    assert( Cba_ObjType(p, iObj) == CBA_BOX_CONCAT );
                    // prepare inputs
                    assert( nInputs >= 0 );
                    Cba_NtkCleanMap2( p );
                    for ( k = 0; k < nInputs; k++ )
                        Cba_NtkSetMap2( p, Cba_NtkStrId(p, pInNames[k]), k+1 );
                    // create bit-level objects
                    for ( w = 0; w < Width; w++ )
                    {
                        // create bit-level flop
                        int iObjNew = Cba_ObjAlloc( p, (Cba_ObjType_t)Type, 4, 1 );
                        if ( Prs_BoxName(pNtk, i) )
                        {
                            NameId = Cba_NtkNewStrId( p, "%s[%d]", Prs_NtkStr(pNtk, Prs_BoxName(pNtk, i)), w );
                            Cba_ObjSetName( p, iObjNew, NameId );
                        }
                        //Cba_VerificSaveLineFile( p, iObjNew, pInst->Linefile() );
                        // set output fon
                        iFon = Cba_ObjFon0(p, iObjNew);
                        {
                            NameId = Cba_NtkNewStrId( p, "%s[%d]", Cba_FonNameStr(p, Cba_ObjFon0(p, iObj)), w );
                            Cba_FonSetName( p, iFon, NameId );
                        }
                        // no need to map this name because it may be produced elsewhere
                        //Cba_NtkSetMap( p, NameId, iFon );
                        // add the flop
                        Cba_ObjSetFinFon( p, iObj, Width-1-w, iFon );
                        // create bit-level flops
                        Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                            if ( Cba_NtkGetMap2(p, FormId) )
                            {
                                int Index = Cba_NtkGetMap2(p, FormId)-1;
                                iFon = Prs_CreateSignalIn( p, pNtk, ActId );  assert( iFon );
                                // create bit-select node for data/set/reset (but not for clock)
                                if ( Index < 3 ) // not clock
                                    iFon = Prs_CreateSlice( p, iFon, pNtk, 0 );
                                Cba_ObjSetFinFon( p, iObjNew, Index, iFon );
                            }
                    }
                    continue;
                }
            }
            assert( Type == Cba_ObjType(p, iObj) );
            //assert( nInputs == -1 || nInputs == Cba_ObjFinNum(p, iObj) );
            // mark PI objects
            Cba_NtkCleanMap2( p );
            if ( Type == CBA_OBJ_BOX )
            {
                Cba_Ntk_t * pBox = Cba_ObjNtk(p, iObj);
                assert( Cba_NtkPiNum(pBox) == Cba_ObjFinNum(p, iObj) );
                assert( Cba_NtkPoNum(pBox) == Cba_ObjFonNum(p, iObj) );
                Cba_NtkForEachPi( pBox, iTerm, k )
                    Cba_NtkSetMap2( p, Cba_ObjName(pBox, iTerm), k+1 );
            }
            else
            {
                assert( nInputs >= 0 );
                for ( k = 0; k < nInputs; k++ )
                    Cba_NtkSetMap2( p, Cba_NtkStrId(p, pInNames[k]), k+1 );
            }
            // connect box fins
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                if ( Cba_NtkGetMap2(p, FormId) )
                {
                    int Index = Cba_NtkGetMap2(p, FormId)-1;
                    int nBits = Cba_ObjFinNum(p, iObj);
                    assert( Index < nBits );
                    iFon = Prs_CreateSignalIn( p, pNtk, ActId );
                    if ( iFon )
                        Cba_ObjSetFinFon( p, iObj, Index, iFon );
                }
            // special cases
            if ( Type == CBA_BOX_NMUX || Type == CBA_BOX_SEL )
            {
                int FonCat = Cba_ObjFinFon( p, iObj, 1 );
                int nBits  = Cba_FonRangeSize( p, FonCat );
                int nParts = Cba_ObjFinNum(p, iObj) - 1;
                int Slice  = nBits / nParts;
                int nFins = Cba_ObjFinNum(p, iObj);
                assert( Cba_ObjFinNum(p, iObj) >= 2 );
                assert( Slice * nParts == nBits );
                assert( nFins == 1 + nParts );
                Cba_ObjCleanFinFon( p, iObj, 1 );
                // create buffer for the constant
                if ( FonCat < 0 ) 
                {
                    int iObjNew = Cba_ObjAlloc( p, CBA_BOX_BUF, 1, 1 );
                    Cba_ObjSetFinFon( p, iObjNew, 0, FonCat );
                    FonCat = Cba_ObjFon0( p, iObjNew );
                    NameId = Cba_NtkNewStrId( p, "_buf_const_%d", iObjNew );
                    Cba_FonSetName( p, FonCat, NameId );
                    Cba_FonSetRange( p, FonCat, Cba_NtkHashRange(p, nBits-1, 0) );
                }
                for ( k = 0; k < nParts; k++ )
                {
//                    iFon = Prs_CreateSlice( p, FonCat, pNtk, Cba_NtkHashRange(p, (nParts-1-k)*Slice+Slice-1, (nParts-1-k)*Slice) );
                    iFon = Prs_CreateSlice( p, FonCat, pNtk, Cba_NtkHashRange(p, k*Slice+Slice-1, k*Slice) );
                    Cba_ObjSetFinFon( p, iObj, k+1, iFon );
                }
            }
        }
        // if carry-in is not supplied, use constant 0
        if ( Type == CBA_BOX_ADD && Cba_ObjFinFon(p, iObj, 0) == 0 )
            Cba_ObjSetFinFon( p, iObj, 0, Cba_FonFromConst(1) );
        // if set or reset are not supplied, use constant 0
        if ( Type == CBA_BOX_DFFRS && Cba_ObjFinFon(p, iObj, 1) == 0 )
            Cba_ObjSetFinFon( p, iObj, 1, Cba_FonFromConst(1) );
        if ( Type == CBA_BOX_DFFRS && Cba_ObjFinFon(p, iObj, 2) == 0 )
            Cba_ObjSetFinFon( p, iObj, 2, Cba_FonFromConst(1) );
    }
    Vec_IntFree( vBox2Obj );
    // connect outputs
    Vec_IntForEachEntryTwo( &pNtk->vOutputs, &pNtk->vOutputsR, NameId, RangeId, i )
    {
        iObj = Cba_NtkPo( p, i );
        assert( NameId == Cba_ObjName(p, iObj) ); // direct name
        iFon = Prs_CreateVerilogFindFon( p, NameId );
        if ( !iFon ) 
            continue;
        Cba_ObjSetFinFon( p, iObj, 0, iFon );
        if ( RangeId )
        {
            assert( Cba_NtkRangeLeft(p, Abc_Lit2Var(RangeId))  == Cba_FonLeft(p, iFon) );
            assert( Cba_NtkRangeRight(p, Abc_Lit2Var(RangeId)) == Cba_FonRight(p, iFon) );
        }
    }
    return 0;
}